

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O0

int png_sig_cmp(png_const_bytep sig,size_t start,size_t num_to_check)

{
  png_byte local_30 [8];
  png_byte png_signature [8];
  size_t num_to_check_local;
  size_t start_local;
  png_const_bytep sig_local;
  
  local_30[0] = 0x89;
  local_30[1] = 'P';
  local_30[2] = 'N';
  local_30[3] = 'G';
  local_30[4] = '\r';
  local_30[5] = '\n';
  local_30[6] = '\x1a';
  local_30[7] = '\n';
  if (num_to_check < 9) {
    png_signature = (png_byte  [8])num_to_check;
    if (num_to_check == 0) {
      return -1;
    }
  }
  else {
    png_signature[0] = '\b';
    png_signature[1] = '\0';
    png_signature[2] = '\0';
    png_signature[3] = '\0';
    png_signature[4] = '\0';
    png_signature[5] = '\0';
    png_signature[6] = '\0';
    png_signature[7] = '\0';
  }
  if (start < 8) {
    if (8 < start + (long)png_signature) {
      png_signature = (png_byte  [8])(8 - start);
    }
    sig_local._4_4_ = memcmp(sig + start,png_signature + (start - 8),(size_t)png_signature);
  }
  else {
    sig_local._4_4_ = -1;
  }
  return sig_local._4_4_;
}

Assistant:

int PNGAPI
png_sig_cmp(png_const_bytep sig, size_t start, size_t num_to_check)
{
   png_byte png_signature[8] = {137, 80, 78, 71, 13, 10, 26, 10};

   if (num_to_check > 8)
      num_to_check = 8;

   else if (num_to_check < 1)
      return (-1);

   if (start > 7)
      return (-1);

   if (start + num_to_check > 8)
      num_to_check = 8 - start;

   return ((int)(memcmp(&sig[start], &png_signature[start], num_to_check)));
}